

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<kj::String&,char_const(&)[9],int_const&,char,unsigned_int,char,kj::String_const&,char_const(&)[9]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [9],int *params_2
          ,char *params_3,uint *params_4,char *params_5,String *params_6,char (*params_7) [9])

{
  String *pSVar1;
  char (*pacVar2) [9];
  kj *this_00;
  char *pcVar3;
  uint *value;
  int *value_00;
  ArrayPtr<const_char> *in_stack_ffffffffffffff30;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  char local_91 [1];
  CappedArray<char,_14UL> local_90;
  char local_71 [1];
  CappedArray<char,_14UL> local_70;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  NoInfer<unsigned_int> *local_38;
  uint *params_local_4;
  char *params_local_3;
  int *params_local_2;
  char (*params_local_1) [9];
  String *params_local;
  
  local_38 = (NoInfer<unsigned_int> *)params_3;
  params_local_4 = (uint *)params_2;
  params_local_3 = *params_1;
  params_local_2 = (int *)params;
  params_local_1 = (char (*) [9])this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::String&>((String *)this);
  local_48 = toCharSequence<kj::String&>(pSVar1);
  pacVar2 = ::const((char (*) [9])params_local_2);
  local_58 = toCharSequence<char_const(&)[9]>(pacVar2);
  this_00 = (kj *)fwd<int_const&>((int *)params_local_3);
  toCharSequence<int_const&>(&local_70,this_00,value_00);
  pcVar3 = fwd<char>((NoInfer<char> *)params_local_4);
  local_71[0] = (char)toCharSequence<char>(pcVar3);
  value = fwd<unsigned_int>(local_38);
  toCharSequence<unsigned_int>(&local_90,value);
  pcVar3 = fwd<char>((NoInfer<char> *)params_4);
  local_91[0] = (char)toCharSequence<char>(pcVar3);
  pSVar1 = fwd<kj::String_const&>((String *)params_5);
  local_a8 = toCharSequence<kj::String_const&>(pSVar1);
  pacVar2 = ::const((char (*) [9])params_6);
  local_b8 = toCharSequence<char_const(&)[9]>(pacVar2);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_48,&local_58,(ArrayPtr<const_char> *)&local_70,
             (CappedArray<char,_14UL> *)local_71,(FixedArray<char,_1UL> *)&local_90,
             (CappedArray<char,_14UL> *)local_91,(FixedArray<char,_1UL> *)&local_a8,&local_b8,
             in_stack_ffffffffffffff30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}